

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void separatetobefnz(lua_State *L,int all)

{
  GCObject *pGVar1;
  GCObject *local_38;
  GCObject **lastnext;
  GCObject *curr;
  GCObject **p;
  global_State *g;
  int all_local;
  lua_State *L_local;
  
  for (local_38 = (GCObject *)&L->l_G->tobefnz; pGVar1 = (GCObject *)&L->l_G->finobj,
      (local_38->gch).next != (GCObject *)0x0; local_38 = (local_38->gch).next) {
  }
  while (curr = pGVar1, pGVar1 = (curr->gch).next, pGVar1 != (GCObject *)0x0) {
    if ((((pGVar1->gch).marked & 3) != 0) || (all != 0)) {
      (pGVar1->gch).marked = (pGVar1->gch).marked | 8;
      (curr->gch).next = (pGVar1->gch).next;
      (pGVar1->gch).next = (local_38->gch).next;
      (local_38->gch).next = pGVar1;
      local_38 = pGVar1;
      pGVar1 = curr;
    }
  }
  return;
}

Assistant:

static void separatetobefnz (lua_State *L, int all) {
  global_State *g = G(L);
  GCObject **p = &g->finobj;
  GCObject *curr;
  GCObject **lastnext = &g->tobefnz;
  /* find last 'next' field in 'tobefnz' list (to add elements in its end) */
  while (*lastnext != NULL)
    lastnext = &gch(*lastnext)->next;
  while ((curr = *p) != NULL) {  /* traverse all finalizable objects */
    lua_assert(!isfinalized(curr));
    lua_assert(testbit(gch(curr)->marked, SEPARATED));
    if (!(iswhite(curr) || all))  /* not being collected? */
      p = &gch(curr)->next;  /* don't bother with it */
    else {
      l_setbit(gch(curr)->marked, FINALIZEDBIT); /* won't be finalized again */
      *p = gch(curr)->next;  /* remove 'curr' from 'finobj' list */
      gch(curr)->next = *lastnext;  /* link at the end of 'tobefnz' list */
      *lastnext = curr;
      lastnext = &gch(curr)->next;
    }
  }
}